

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

SerialArena * __thiscall
google::protobuf::internal::ThreadSafeArena::GetSerialArenaFallback(ThreadSafeArena *this,void *me)

{
  bool bVar1;
  SerialArena *pSVar2;
  AllocationPolicy *policy_ptr;
  void *in_RCX;
  Memory mem;
  SerialArena *local_38;
  SerialArena *head;
  void *local_28;
  SerialArena *local_20;
  SerialArena *serial;
  void *me_local;
  ThreadSafeArena *this_local;
  
  serial = (SerialArena *)me;
  me_local = this;
  local_20 = std::atomic<google::protobuf::internal::SerialArena_*>::load
                       ((atomic<google::protobuf::internal::SerialArena_*> *)(this + 0x10),
                        memory_order_acquire);
  while ((local_20 != (SerialArena *)0x0 &&
         (pSVar2 = (SerialArena *)SerialArena::owner(local_20), pSVar2 != serial))) {
    local_20 = SerialArena::next(local_20);
  }
  if (local_20 == (SerialArena *)0x0) {
    policy_ptr = TaggedAllocationPolicyPtr::get((TaggedAllocationPolicyPtr *)(this + 8));
    _head = AllocateMemory(policy_ptr,0,0x38);
    mem.size = (size_t)serial;
    mem.ptr = local_28;
    local_20 = SerialArena::New(head,mem,in_RCX);
    local_38 = std::atomic<google::protobuf::internal::SerialArena_*>::load
                         ((atomic<google::protobuf::internal::SerialArena_*> *)(this + 0x10),
                          memory_order_relaxed);
    do {
      SerialArena::set_next(local_20,local_38);
      bVar1 = std::atomic<google::protobuf::internal::SerialArena_*>::compare_exchange_weak
                        ((atomic<google::protobuf::internal::SerialArena_*> *)(this + 0x10),
                         &local_38,local_20,memory_order_release,memory_order_relaxed);
    } while (((bVar1 ^ 0xffU) & 1) != 0);
  }
  CacheSerialArena(this,local_20);
  return local_20;
}

Assistant:

PROTOBUF_NOINLINE
SerialArena* ThreadSafeArena::GetSerialArenaFallback(void* me) {
  // Look for this SerialArena in our linked list.
  SerialArena* serial = threads_.load(std::memory_order_acquire);
  for (; serial; serial = serial->next()) {
    if (serial->owner() == me) {
      break;
    }
  }

  if (!serial) {
    // This thread doesn't have any SerialArena, which also means it doesn't
    // have any blocks yet.  So we'll allocate its first block now.
    serial = SerialArena::New(
        AllocateMemory(alloc_policy_.get(), 0, kSerialArenaSize), me);

    SerialArena* head = threads_.load(std::memory_order_relaxed);
    do {
      serial->set_next(head);
    } while (!threads_.compare_exchange_weak(
        head, serial, std::memory_order_release, std::memory_order_relaxed));
  }

  CacheSerialArena(serial);
  return serial;
}